

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O0

float Gia_ObjPropagateRequired(Gia_Man_t *p,int iObj,int fUseSorting)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  int *piVar4;
  float fVar5;
  float *pDelays;
  float local_128;
  float tRequired;
  float pPinDelays [32];
  int pPinPerm [32];
  int iFanin;
  int k;
  If_LibLut_t *pLutLib;
  int fUseSorting_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  pvVar1 = p->pLutLib;
  pDelays._4_4_ = 0.0;
  iVar3 = Gia_ObjIsLut(p,iObj);
  if (iVar3 != 0) {
    if (pvVar1 == (void *)0x0) {
      fVar5 = Gia_ObjTimeRequired(p,iObj);
      pDelays._4_4_ = fVar5 - 1.0;
      for (pPinPerm[0x1f] = 0; iVar3 = Gia_ObjLutSize(p,iObj), pPinPerm[0x1f] < iVar3;
          pPinPerm[0x1f] = pPinPerm[0x1f] + 1) {
        piVar4 = Gia_ObjLutFanins(p,iObj);
        iVar3 = piVar4[pPinPerm[0x1f]];
        fVar5 = Gia_ObjTimeRequired(p,iVar3);
        if (pDelays._4_4_ < fVar5) {
          Gia_ObjSetTimeRequired(p,iVar3,pDelays._4_4_);
        }
      }
    }
    else if (*(int *)((long)pvVar1 + 0xc) == 0) {
      iVar3 = Gia_ObjLutSize(p,iObj);
      fVar5 = Gia_ObjTimeRequired(p,iObj);
      pDelays._4_4_ = fVar5 - *(float *)((long)pvVar1 + (long)iVar3 * 0x84 + 0x94);
      for (pPinPerm[0x1f] = 0; iVar3 = Gia_ObjLutSize(p,iObj), pPinPerm[0x1f] < iVar3;
          pPinPerm[0x1f] = pPinPerm[0x1f] + 1) {
        piVar4 = Gia_ObjLutFanins(p,iObj);
        iVar3 = piVar4[pPinPerm[0x1f]];
        fVar5 = Gia_ObjTimeRequired(p,iVar3);
        if (pDelays._4_4_ < fVar5) {
          Gia_ObjSetTimeRequired(p,iVar3,pDelays._4_4_);
        }
      }
    }
    else {
      iVar3 = Gia_ObjLutSize(p,iObj);
      lVar2 = (long)iVar3 * 0x84 + 0x94;
      if (fUseSorting == 0) {
        for (pPinPerm[0x1f] = 0; iVar3 = Gia_ObjLutSize(p,iObj), pPinPerm[0x1f] < iVar3;
            pPinPerm[0x1f] = pPinPerm[0x1f] + 1) {
          piVar4 = Gia_ObjLutFanins(p,iObj);
          iVar3 = piVar4[pPinPerm[0x1f]];
          fVar5 = Gia_ObjTimeRequired(p,iObj);
          pDelays._4_4_ = fVar5 - *(float *)((long)pvVar1 + (long)pPinPerm[0x1f] * 4 + lVar2);
          fVar5 = Gia_ObjTimeRequired(p,iVar3);
          if (pDelays._4_4_ < fVar5) {
            Gia_ObjSetTimeRequired(p,iVar3,pDelays._4_4_);
          }
        }
      }
      else {
        Gia_LutDelayTraceSortPins(p,iObj,(int *)(pPinDelays + 0x1e),&local_128);
        for (pPinPerm[0x1f] = 0; iVar3 = Gia_ObjLutSize(p,iObj), pPinPerm[0x1f] < iVar3;
            pPinPerm[0x1f] = pPinPerm[0x1f] + 1) {
          Gia_ObjLutFanins(p,iObj);
          fVar5 = Gia_ObjTimeRequired(p,iObj);
          pDelays._4_4_ = fVar5 - *(float *)((long)pvVar1 + (long)pPinPerm[0x1f] * 4 + lVar2);
          iVar3 = Gia_ObjLutFanin(p,iObj,(int)pPinDelays[(long)pPinPerm[0x1f] + 0x1e]);
          fVar5 = Gia_ObjTimeRequired(p,iVar3);
          if (pDelays._4_4_ < fVar5) {
            iVar3 = Gia_ObjLutFanin(p,iObj,(int)pPinDelays[(long)pPinPerm[0x1f] + 0x1e]);
            Gia_ObjSetTimeRequired(p,iVar3,pDelays._4_4_);
          }
        }
      }
    }
    return pDelays._4_4_;
  }
  __assert_fail("Gia_ObjIsLut(p, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSpeedup.c"
                ,0xb1,"float Gia_ObjPropagateRequired(Gia_Man_t *, int, int)");
}

Assistant:

float Gia_ObjPropagateRequired( Gia_Man_t * p, int iObj, int fUseSorting )
{
    If_LibLut_t * pLutLib = (If_LibLut_t *)p->pLutLib;
    int k, iFanin, pPinPerm[32];
    float pPinDelays[32];
    float tRequired = 0.0; // Suppress "might be used uninitialized"
    float * pDelays;
    assert( Gia_ObjIsLut(p, iObj) );
    if ( pLutLib == NULL )
    {
        tRequired = Gia_ObjTimeRequired( p, iObj) - (float)1.0;
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( Gia_ObjTimeRequired(p, iFanin) > tRequired )
                Gia_ObjSetTimeRequired( p, iFanin, tRequired );
    }
    else if ( !pLutLib->fVarPinDelays )
    {
        pDelays = pLutLib->pLutDelays[Gia_ObjLutSize(p, iObj)];
        tRequired = Gia_ObjTimeRequired(p, iObj) - pDelays[0];
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( Gia_ObjTimeRequired(p, iFanin) > tRequired )
                Gia_ObjSetTimeRequired( p, iFanin, tRequired );
    }
    else 
    {
        pDelays = pLutLib->pLutDelays[Gia_ObjLutSize(p, iObj)];
        if ( fUseSorting )
        {
            Gia_LutDelayTraceSortPins( p, iObj, pPinPerm, pPinDelays );
            Gia_LutForEachFanin( p, iObj, iFanin, k )
            {
                tRequired = Gia_ObjTimeRequired( p, iObj) - pDelays[k];
                if ( Gia_ObjTimeRequired( p, Gia_ObjLutFanin(p, iObj,pPinPerm[k])) > tRequired )
                    Gia_ObjSetTimeRequired( p,  Gia_ObjLutFanin(p, iObj,pPinPerm[k]), tRequired );
            }
        }
        else
        {
            Gia_LutForEachFanin( p, iObj, iFanin, k )
            {
                tRequired = Gia_ObjTimeRequired(p, iObj) - pDelays[k];
                if ( Gia_ObjTimeRequired(p, iFanin) > tRequired )
                    Gia_ObjSetTimeRequired( p,  iFanin, tRequired );
            }
        }
    }
    return tRequired;
}